

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void cppcms::xss::anon_unknown_8::load_from_json(rules *r,value *v)

{
  key_type *__x;
  pointer pvVar1;
  pointer ppVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  json_type jVar5;
  value *pvVar6;
  array *paVar7;
  value *this;
  size_type sVar8;
  array *paVar9;
  cppcms_error *pcVar10;
  ostream *poVar11;
  string *property;
  ulong uVar12;
  string *tag_name;
  data *pdVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  pair<std::_Rb_tree_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar18;
  allocator local_439;
  string *local_438;
  rules *local_430;
  value attrs_val;
  int pos2;
  int pos;
  string type;
  validator_type validator;
  regex rg;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  all_new_pairs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  str_vec entities;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  all_tags_attrs;
  string encoding;
  ostringstream ss;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_tags;
  
  _Var3._M_p = _ss;
  ss = (ostringstream)0x1;
  bVar4 = json::value::get<bool>(v,"xhtml",(bool *)&ss);
  ((r->d).ptr_)->is_xhtml = bVar4;
  ss = (ostringstream)0x0;
  bVar4 = json::value::get<bool>(v,"comments",(bool *)&ss);
  ((r->d).ptr_)->comments_allowed = bVar4;
  _ss = _Var3._M_p & 0xffffffffffffff00;
  bVar4 = json::value::get<bool>(v,"numeric_entities",(bool *)&ss);
  ((r->d).ptr_)->numeric_entities_allowed = bVar4;
  _ss = (pointer)0x0;
  json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&entities,v,"entities",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ss);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ss);
  lVar15 = 0;
  for (uVar17 = 0;
      uVar17 < (ulong)((long)entities.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)entities.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar17 = uVar17 + 1) {
    rules::add_entity(r,(string *)
                        ((long)&((entities.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar15));
    lVar15 = lVar15 + 0x20;
  }
  json::value::get_abi_cxx11_(&encoding,v,"encoding","");
  if (encoding._M_string_length != 0) {
    rules::encoding(r,&encoding);
  }
  all_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &all_tags._M_t._M_impl.super__Rb_tree_header._M_header;
  all_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  all_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  all_tags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  all_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       all_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&ss,"opening_and_closing",(allocator *)&all_tags_attrs);
  load_tags_from_json(r,v,(string *)&ss,opening_and_closing,&all_tags);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"stand_alone",(allocator *)&all_tags_attrs);
  load_tags_from_json(r,v,(string *)&ss,stand_alone,&all_tags);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"any_tag",(allocator *)&all_tags_attrs);
  load_tags_from_json(r,v,(string *)&ss,any_tag,&all_tags);
  std::__cxx11::string::~string((string *)&ss);
  pvVar6 = json::value::find(v,"attributes");
  json::value::copyable::copyable(&attrs_val.d,&pvVar6->d);
  bVar4 = json::value::is_undefined(&attrs_val);
  if (!bVar4) {
    jVar5 = json::value::type(&attrs_val);
    if (jVar5 != is_array) {
      pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"xss::rules: attributes is expected to be an array",
                 (allocator *)&all_tags_attrs);
      cppcms_error::cppcms_error(pcVar10,(string *)&ss);
      __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_430 = r;
    paVar7 = json::value::array(&attrs_val);
    all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_header;
    all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar17 = 0;
    all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         all_tags_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      pvVar1 = (paVar7->
               super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(paVar7->
                        super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) <= uVar17)
      break;
      jVar5 = json::value::type(pvVar1 + uVar17);
      if (jVar5 != is_object) {
        pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"xss::rules: attributes is expected to be an array of objects",
                   (allocator *)&type);
        cppcms_error::cppcms_error(pcVar10,(string *)&ss);
        __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      all_new_pairs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_new_pairs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_new_pairs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar6 = (paVar7->
               super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar17;
      _ss = (pointer)0x0;
      json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&type,pvVar6,"tags",
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ss);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ss);
      _ss = (pointer)0x0;
      json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&validator,pvVar6,"attributes",
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ss);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ss);
      for (uVar16 = 0;
          uVar16 < (ulong)((long)(type._M_string_length - (long)type._M_dataplus._M_p) >> 5);
          uVar16 = uVar16 + 1) {
        lVar15 = 0;
        for (uVar12 = 0;
            uVar12 < (ulong)((long)(validator.super__Function_base._M_functor._8_8_ -
                                   validator.super__Function_base._M_functor._0_8_) >> 5);
            uVar12 = uVar12 + 1) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ss,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (type._M_dataplus._M_p + uVar16 * 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)validator.super__Function_base._M_functor._M_unused._0_8_ + lVar15));
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&all_new_pairs,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ss);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ss);
          lVar15 = lVar15 + 0x20;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&validator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&type);
      this = json::value::find(pvVar6,"pairs");
      bVar4 = json::value::is_undefined(this);
      if (!bVar4) {
        jVar5 = json::value::type(this);
        if (jVar5 != is_array) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar11 = std::operator<<((ostream *)&ss,"xss::rules: invalid object type for attributes["
                                   );
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::operator<<(poVar11,"].pairs");
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::stringbuf::str();
          cppcms_error::cppcms_error(pcVar10,&type);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        paVar9 = json::value::array(this);
        lVar15 = 0;
        for (uVar16 = 0;
            pvVar1 = (paVar9->
                     super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar16 < (ulong)((long)(paVar9->
                                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3);
            uVar16 = uVar16 + 1) {
          json::value::get<std::__cxx11::string>
                    (&type,(value *)((long)&(pvVar1->d).d.ptr_ + lVar15),"tag");
          json::value::get<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&validator
                     ,(value *)((long)&(((paVar9->
                                         super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->d).d.ptr_ +
                               lVar15),"attr");
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ss,&type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&validator
                    );
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&all_new_pairs,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ss);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ss);
          std::__cxx11::string::~string((string *)&validator);
          std::__cxx11::string::~string((string *)&type);
          lVar15 = lVar15 + 8;
        }
      }
      if (all_new_pairs.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          all_new_pairs.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"xss::rules: no tags/attributes defined in attributes",
                   (allocator *)&type);
        cppcms_error::cppcms_error(pcVar10,(string *)&ss);
        __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      json::value::get<std::__cxx11::string>(&type,pvVar6,"type");
      uVar16 = 0xffffffffffffffff;
      lVar15 = 0;
      while( true ) {
        lVar14 = lVar15;
        ppVar2 = all_new_pairs.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = uVar16 + 1;
        if ((ulong)((long)all_new_pairs.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)all_new_pairs.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar16) break;
        __x = (key_type *)
              ((long)&((all_new_pairs.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + lVar14
              );
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&all_tags,__x);
        if (sVar8 != 1) {
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &validator,"xss::rules: tags ",__x);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &validator," enlisted in attributes setis not defined in tags part");
          cppcms_error::cppcms_error(pcVar10,(string *)&ss);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        pVar18 = std::
                 _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                 ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
                           ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                             *)&all_tags_attrs,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&((all_new_pairs.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first).
                                       _M_dataplus._M_p + lVar14));
        lVar15 = lVar14 + 0x40;
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+(&local_3a0,"xss::rules: duplicate tag/attribute pair: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(ppVar2->first)._M_dataplus._M_p + lVar14));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &validator,&local_3a0,":");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &validator,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(ppVar2->second)._M_dataplus._M_p + lVar14));
          cppcms_error::cppcms_error(pcVar10,(string *)&ss);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
      booster::regex::regex(&rg);
      validator.super__Function_base._M_manager = (_Manager_type)0x0;
      validator._M_invoker = (_Invoker_type)0x0;
      validator.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      validator.super__Function_base._M_functor._8_8_ = 0;
      bVar4 = std::operator==(&type,"regex");
      if (bVar4) {
        json::value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,pvVar6,
                   "expression");
        booster::regex::regex((regex *)&local_3a0,(string *)&ss,0);
        booster::regex::operator=(&rg,(regex *)&local_3a0);
        booster::regex::~regex((regex *)&local_3a0);
        std::__cxx11::string::~string((string *)&ss);
      }
      bVar4 = std::operator==(&type,"uri");
      if (bVar4) {
LAB_0024336c:
        bVar4 = std::operator!=(&type,"uri");
        std::__cxx11::string::string
                  ((string *)&local_3a0,"(http|https|ftp|mailto|news|nntp)",&local_439);
        json::value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,pvVar6,
                   "scheme",&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        rules::uri_validator((validator_type *)&local_3a0,(string *)&ss,bVar4);
        std::function<bool_(const_char_*,_const_char_*)>::operator=
                  (&validator,(function<bool_(const_char_*,_const_char_*)> *)&local_3a0);
        std::_Function_base::~_Function_base((_Function_base *)&local_3a0);
        std::__cxx11::string::~string((string *)&ss);
      }
      else {
        bVar4 = std::operator==(&type,"absolute_uri");
        if (bVar4) goto LAB_0024336c;
      }
      lVar15 = 0x20;
      for (uVar16 = 0;
          uVar16 < (ulong)((long)all_new_pairs.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)all_new_pairs.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 6);
          uVar16 = uVar16 + 1) {
        tag_name = (string *)
                   ((long)all_new_pairs.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x20);
        property = (string *)
                   ((long)&((all_new_pairs.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                   lVar15);
        bVar4 = std::operator==(&type,"boolean");
        if (bVar4) {
          rules::add_boolean_property(local_430,tag_name,property);
        }
        else {
          local_438 = tag_name;
          bVar4 = std::operator==(&type,"integer");
          if (bVar4) {
            rules::add_integer_property(local_430,local_438,property);
          }
          else {
            bVar4 = std::operator==(&type,"relative_uri");
            if (bVar4) {
              rules::relative_uri_validator();
              pdVar13 = (local_430->d).ptr_;
              if (pdVar13->is_xhtml == false) {
                pdVar13 = (data *)&pdVar13->html_rules;
              }
              (*(pdVar13->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder[1])
                        (pdVar13,local_438,property,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&ss);
              std::_Function_base::~_Function_base((_Function_base *)&ss);
            }
            else {
              bVar4 = std::operator==(&type,"regex");
              if (bVar4) {
                rules::add_property(local_430,local_438,property,&rg);
              }
              else {
                bVar4 = std::operator==(&type,"uri");
                if (!bVar4) {
                  bVar4 = std::operator==(&type,"absolute_uri");
                  if (!bVar4) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
                    poVar11 = std::operator<<((ostream *)&ss,"xss::rules: invalid attributes[");
                    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                    poVar11 = std::operator<<(poVar11,"].type=");
                    std::operator<<(poVar11,(string *)&type);
                    pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
                    std::__cxx11::stringbuf::str();
                    cppcms_error::cppcms_error(pcVar10,&local_3a0);
                    __cxa_throw(pcVar10,&cppcms_error::typeinfo,
                                booster::runtime_error::~runtime_error);
                  }
                }
                pdVar13 = (local_430->d).ptr_;
                if (pdVar13->is_xhtml == false) {
                  pdVar13 = (data *)&pdVar13->html_rules;
                }
                (*(pdVar13->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder[1])
                          (pdVar13,local_438,property,&validator);
              }
            }
          }
        }
        lVar15 = lVar15 + 0x40;
      }
      std::_Function_base::~_Function_base(&validator.super__Function_base);
      booster::regex::~regex(&rg);
      std::__cxx11::string::~string((string *)&type);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&all_new_pairs);
      uVar17 = uVar17 + 1;
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&all_tags_attrs._M_t);
  }
  json::value::copyable::~copyable(&attrs_val.d);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&all_tags._M_t);
  std::__cxx11::string::~string((string *)&encoding);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&entities);
  return;
}

Assistant:

void load_from_json(rules &r,json::value const &v)
		{
			char const *last="";
			int pos = -1,pos2=-1;
			try {
				last="xhtml";
				r.html(v.get("xhtml",true) ? rules::xhtml_input : rules::html_input);
				last="comments";
				r.comments_allowed(v.get("comments",false));
				last="numeric_entities";
				r.numeric_entities_allowed(v.get("numeric_entities",false));
				typedef std::vector<std::string> str_vec;
				last="entities";
				str_vec entities = v.get("entities",str_vec());
				for(size_t i=0;i<entities.size();i++) {
					r.add_entity(entities[i]);
				}
				last="encoding";
				std::string encoding = v.get("encoding","");
				if(!encoding.empty()) {
					r.encoding(encoding);
				}
				std::set<std::string> all_tags;
				last="tags.opening_and_closing";
				load_tags_from_json(r,v,"opening_and_closing",rules::opening_and_closing,all_tags);
				last="tags.stand_alone";
				load_tags_from_json(r,v,"stand_alone",rules::stand_alone,all_tags);
				last="tags.any_tag";
				load_tags_from_json(r,v,"any_tag",rules::any_tag,all_tags);
				json::value attrs_val = v.find("attributes");
				if(attrs_val.is_undefined())
					return;
				if(attrs_val.type()!=json::is_array) {
					throw cppcms_error("xss::rules: attributes is expected to be an array");
				}
				json::array const &attributes = attrs_val.array();
				std::set<std::pair<std::string,std::string> > all_tags_attrs;
				for(size_t i=0;i< attributes.size();i++) {
					pos = i;
					if(attributes[i].type()!=json::is_object) {
						throw cppcms_error("xss::rules: attributes is expected to be an array of objects");
					}
					std::vector<std::pair<std::string,std::string> > all_new_pairs;

					json::value const &attr = attributes[i];

					{ // add tags/attr
						last="attributes[{1}].tags";
						str_vec tags = attr.get("tags",str_vec());
						last="attributes[{1}].attributes";
						str_vec names = attr.get("attributes",str_vec());
						for(size_t j=0;j<tags.size();j++) 
							for(size_t k=0;k<names.size();k++)
								all_new_pairs.push_back(std::make_pair(tags[j],names[k]));
					}
		
					{ // add pairs
						json::value const &pairs = attr.find("pairs");
						if(!pairs.is_undefined()) {
							if(pairs.type()!=json::is_array) {
								std::ostringstream ss;
								ss << "xss::rules: invalid object type for attributes[" 
									<< i <<"].pairs";
								throw cppcms_error(ss.str());
							}
							json::array const &ar=pairs.array();
							for(size_t j=0;j<ar.size();j++) {
								pos2=j;
								last="attributes[{1}].pairs[{2}].tag";
								std::string tag=ar[j].get<std::string>("tag");
								last="attributes[{1}].pairs[{2}].attr";
								std::string attr=ar[j].get<std::string>("attr");
								all_new_pairs.push_back(std::make_pair(tag,attr));
							}
						}
					}

					if(all_new_pairs.empty()) {
						throw cppcms_error("xss::rules: no tags/attributes defined in attributes");
					}

					last="attributes[{1}].type";
					std::string type = attr.get<std::string>("type");

					for(size_t j=0;j<all_new_pairs.size();j++) {
						std::string const &tag=all_new_pairs[j].first;
						std::string const &attr=all_new_pairs[j].second;
						if(all_tags.count(tag)!=1)
							throw cppcms_error("xss::rules: tags " + tag 
									+ " enlisted in attributes set"
									"is not defined in tags part");
						if(all_tags_attrs.insert(all_new_pairs[j]).second == false) 
							throw cppcms_error("xss::rules: duplicate tag/attribute pair: " 
									+ tag + ":" + attr);
					}
					
					booster::regex rg;
					rules::validator_type validator;
					
					if(type == "regex") {
						last="attributes[{1}].expression";
						rg = booster::regex(attr.get<std::string>("expression"));
					}

					if(type=="uri" || type=="absolute_uri") {
						bool absolute_only = type != "uri";
						last="attributes[{1}].scheme";
						std::string scheme = attr.get<std::string>("scheme",basic_allowed_schemes);
						validator = rules::uri_validator(scheme,absolute_only);
					}

					for(size_t j=0;j<all_new_pairs.size();j++) {
						std::string const &tag  =all_new_pairs[j].first;
						std::string const &attr =all_new_pairs[j].second;

						if(type == "boolean")
							r.add_boolean_property(tag,attr);
						else if(type == "integer")
							r.add_integer_property(tag,attr);
						else if(type == "relative_uri") 
							r.add_property(tag,attr,rules::relative_uri_validator());
						else if(type == "regex") 
							r.add_property(tag,attr,rg);
						else if(type == "uri" || type == "absolute_uri") 
							r.add_property(tag,attr,validator);
						else {
							std::ostringstream ss;
							ss <<"xss::rules: invalid attributes[" << i << "].type="<<type;
							throw cppcms_error(ss.str());
						}
					}
				} // for attributes
			}
			catch(json::bad_value_cast const &) {
				std::ostringstream ss;
				ss << "xss::rules:invalid type for "
				   << booster::locale::format(last) % pos % pos2;
				throw cppcms_error(ss.str());
			}
		}